

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O3

void box_cb(Fl_Choice *i,void *v)

{
  Fl_Menu_Item *pFVar1;
  int iVar2;
  long lVar3;
  void *pvVar4;
  void *pvVar5;
  void **ppvVar6;
  Fl_Widget_Type *q;
  Fl_Widget_Type *this;
  bool bVar7;
  uchar uVar8;
  
  if ((char *)v == "LOAD") {
    iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1e])();
    if (iVar2 != 0) {
      Fl_Widget::deactivate((Fl_Widget *)i);
      return;
    }
    Fl_Widget::activate((Fl_Widget *)i);
    pvVar5 = (void *)(ulong)current_widget->o->box_;
    pvVar4 = (void *)0x3e8;
    if (pvVar5 != (void *)0x0) {
      pvVar4 = pvVar5;
    }
    ppvVar6 = &boxmenu[0].user_data_;
    lVar3 = 0;
    do {
      if (pvVar4 == *ppvVar6) {
        Fl_Choice::value(i,(int)lVar3);
        return;
      }
      lVar3 = lVar3 + 1;
      ppvVar6 = ppvVar6 + 7;
    } while (lVar3 != 0x3d);
  }
  else {
    pFVar1 = (i->super_Fl_Menu_).value_;
    if (pFVar1 == (Fl_Menu_Item *)0x0) {
      lVar3 = -1;
    }
    else {
      lVar3 = (long)((int)((ulong)((long)pFVar1 - (long)(i->super_Fl_Menu_).menu_) >> 3) *
                    -0x49249249);
    }
    iVar2 = (int)boxmenu[lVar3].user_data_;
    if ((iVar2 != 0) && (Fl_Type::first != (Fl_Type *)0x0)) {
      uVar8 = (uchar)boxmenu[lVar3].user_data_;
      if (iVar2 == 1000) {
        uVar8 = '\0';
      }
      bVar7 = true;
      this = (Fl_Widget_Type *)Fl_Type::first;
      do {
        while (((this->super_Fl_Type).selected != '\0' &&
               (iVar2 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x17])(this), iVar2 != 0))) {
          this->o->box_ = uVar8;
          Fl_Widget_Type::redraw(this);
          this = (Fl_Widget_Type *)(this->super_Fl_Type).next;
          bVar7 = false;
          if (this == (Fl_Widget_Type *)0x0) {
LAB_001841db:
            set_modflag(1);
            return;
          }
        }
        this = (Fl_Widget_Type *)(this->super_Fl_Type).next;
      } while (this != (Fl_Widget_Type *)0x0);
      if (bVar7) {
        return;
      }
      goto LAB_001841db;
    }
  }
  return;
}

Assistant:

void box_cb(Fl_Choice* i, void *v) {
  if (v == LOAD) {
    if (current_widget->is_menu_item()) {i->deactivate(); return;} else i->activate();
    int n = current_widget->o->box(); if (!n) n = ZERO_ENTRY;
    for (int j = 0; j < int(sizeof(boxmenu)/sizeof(*boxmenu)); j++)
      if (boxmenu[j].argument() == n) {i->value(j); break;}
  } else {
    int mod = 0;
    int m = i->value();
    int n = int(boxmenu[m].argument());
    if (!n) return; // should not happen
    if (n == ZERO_ENTRY) n = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
        q->o->box((Fl_Boxtype)n);
        q->redraw();
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}